

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[25],kj::StringPtr,char_const(&)[20],unsigned_int&,char_const(&)[30]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [25],StringPtr *params_1,
          char (*params_2) [20],uint *params_3,char (*params_4) [30])

{
  char (*value) [25];
  StringPtr *value_00;
  char (*value_01) [20];
  _ *this_00;
  char (*value_02) [30];
  uint *value_03;
  ArrayPtr<const_char> *in_stack_ffffffffffffff58;
  ArrayPtr<const_char> local_90;
  CappedArray<char,_14UL> local_80;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char (*local_38) [30];
  char (*params_local_4) [30];
  uint *params_local_3;
  char (*params_local_2) [20];
  StringPtr *params_local_1;
  char (*params_local) [25];
  
  local_38 = (char (*) [30])params_3;
  params_local_4 = (char (*) [30])params_2;
  params_local_3 = (uint *)params_1;
  params_local_2 = (char (*) [20])params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [25])__return_storage_ptr__;
  value = ::const((char (*) [25])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[25]>(value);
  value_00 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_local_2);
  local_58 = _::toStringTreeOrCharSequence<kj::StringPtr>(value_00);
  value_01 = ::const((char (*) [20])params_local_3);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[20]>(value_01);
  this_00 = (_ *)fwd<unsigned_int&>((uint *)params_local_4);
  _::toStringTreeOrCharSequence<unsigned_int&>(&local_80,this_00,value_03);
  value_02 = ::const(local_38);
  local_90 = _::toStringTreeOrCharSequence<char_const(&)[30]>(value_02);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)&local_80,(CappedArray<char,_14UL> *)&local_90,
             in_stack_ffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}